

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spake2plus.cc
# Opt level: O0

bool __thiscall
bssl::spake2plus::Verifier::VerifyProverConfirmation
          (Verifier *this,Span<const_unsigned_char> peer_confirm)

{
  int iVar1;
  size_t sVar2;
  uchar *in_b;
  Verifier *this_local;
  Span<const_unsigned_char> peer_confirm_local;
  
  peer_confirm_local.data_ = (uchar *)peer_confirm.size_;
  this_local = (Verifier *)peer_confirm.data_;
  if ((this->state_ == kProverShareSeen) &&
     (sVar2 = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)&this_local),
     sVar2 == 0x20)) {
    in_b = Span<const_unsigned_char>::data((Span<const_unsigned_char> *)&this_local);
    iVar1 = CRYPTO_memcmp(this->confirm_,in_b,0x20);
    if (iVar1 == 0) {
      this->state_ = kDone;
      return true;
    }
  }
  ERR_put_error(0xe,0,0x44,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/spake2plus/spake2plus.cc"
                ,0x1eb);
  return false;
}

Assistant:

bool Verifier::VerifyProverConfirmation(Span<const uint8_t> peer_confirm) {
  if (state_ != State::kProverShareSeen ||    //
      peer_confirm.size() != kConfirmSize ||  //
      CRYPTO_memcmp(confirm_, peer_confirm.data(), sizeof(confirm_)) != 0) {
    OPENSSL_PUT_ERROR(CRYPTO, ERR_R_INTERNAL_ERROR);
    return false;
  }

  state_ = State::kDone;
  return true;
}